

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::detectDominatedCol
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col,
          bool handleSingletonRows)

{
  double dVar1;
  double dVar2;
  Result RVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool logging_on;
  bool handleSingletonRows_local;
  undefined1 local_98 [16];
  anon_class_32_4_9aef3f16 weaklyDominatedCol;
  anon_class_32_4_9aef3f16 dominatedCol;
  
  handleSingletonRows_local = handleSingletonRows;
  dVar1 = HighsLinearSumBounds::getSumLower
                    (&this->impliedDualRowBounds,col,
                     -(this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[col]);
  local_98._8_4_ = extraout_XMM0_Dc;
  local_98._0_8_ = dVar1;
  local_98._12_4_ = extraout_XMM0_Dd;
  dVar1 = HighsLinearSumBounds::getSumUpper
                    (&this->impliedDualRowBounds,col,
                     -(this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[col]);
  logging_on = (this->analysis_).logging_on_;
  weaklyDominatedCol.logging_on = &logging_on;
  weaklyDominatedCol.this = this;
  weaklyDominatedCol.postsolve_stack = postsolve_stack;
  weaklyDominatedCol.handleSingletonRows = &handleSingletonRows_local;
  dominatedCol.this = this;
  dominatedCol.logging_on = weaklyDominatedCol.logging_on;
  dominatedCol.postsolve_stack = postsolve_stack;
  dominatedCol.handleSingletonRows = &handleSingletonRows_local;
  RVar3 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                    (&dominatedCol,col,-dVar1,
                     (this->model->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[col],1);
  if (RVar3 == kOk) {
    RVar3 = kOk;
    if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[col] == '\0') {
      dVar2 = local_98._0_8_;
      local_98._0_8_ = (ulong)dVar2 ^ 0x8000000000000000;
      local_98._12_4_ = local_98._12_4_ ^ 0x80000000;
      RVar3 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                        (&dominatedCol,col,-dVar2,
                         (this->model->col_upper_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[col],-1);
      if ((((RVar3 == kOk) &&
           (RVar3 = kOk,
           (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[col] == '\0')) &&
          (RVar3 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                             (&weaklyDominatedCol,col,-dVar1,
                              (this->model->col_lower_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[col],
                              (this->model->col_upper_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[col],1), RVar3 == kOk)) &&
         (RVar3 = kOk,
         (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[col] == '\0')) {
        RVar3 = detectDominatedCol::anon_class_32_4_9aef3f16::operator()
                          (&weaklyDominatedCol,col,(double)local_98._0_8_,
                           (this->model->col_upper_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[col],
                           (this->model->col_lower_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[col],-1);
      }
    }
  }
  return RVar3;
}

Assistant:

HPresolve::Result HPresolve::detectDominatedCol(
    HighsPostsolveStack& postsolve_stack, HighsInt col,
    bool handleSingletonRows) {
  assert(!colDeleted[col]);

  // get bounds on column dual
  double colDualUpper =
      -impliedDualRowBounds.getSumLower(col, -model->col_cost_[col]);
  double colDualLower =
      -impliedDualRowBounds.getSumUpper(col, -model->col_cost_[col]);

  const bool logging_on = analysis_.logging_on_;

  auto dominatedCol = [&](HighsInt col, double dualBound, double bound,
                          HighsInt direction) {
    // column is (strongly) dominated if the bounds on the column dual satisfy:
    // 1. lower bound >  dual feasibility tolerance (direction =  1) or
    // 2. upper bound < -dual feasibility tolerance (direction = -1).
    if (direction * dualBound <= options->dual_feasibility_tolerance)
      return Result::kOk;
    // cannot fix to +-infinity -> infeasible
    if (direction * bound == -kHighsInf) return Result::kDualInfeasible;
    if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
    // fix variable
    bool unbounded = false;
    if (direction > 0)
      unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
    else
      unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
    if (unbounded) {
      // Handle unboundedness
      presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
      return Result::kDualInfeasible;
    }
    analysis_.logging_on_ = logging_on;
    if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
    // handle row singletons (if requested)
    if (handleSingletonRows)
      HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
    return checkLimits(postsolve_stack);
  };

  auto weaklyDominatedCol = [&](HighsInt col, double dualBound, double bound,
                                double otherBound, HighsInt direction) {
    // column is weakly dominated if the bounds on the column dual satisfy:
    // 1. lower bound >= -dual feasibility tolerance (direction =  1) or
    // 2. upper bound <=  dual feasibility tolerance (direction = -1).
    if (direction * dualBound < -options->dual_feasibility_tolerance)
      return Result::kOk;
    if (direction * bound != -kHighsInf) {
      if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleDominatedCol);
      // fix variable
      bool unbounded = false;
      if (direction > 0)
        unbounded = fixColToLowerOrUnbounded(postsolve_stack, col);
      else
        unbounded = fixColToUpperOrUnbounded(postsolve_stack, col);
      if (unbounded) {
        // Handle unboundedness
        presolve_status_ = HighsPresolveStatus::kUnboundedOrInfeasible;
        return Result::kDualInfeasible;
      }
      analysis_.logging_on_ = logging_on;
      if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDominatedCol);
      // handle row singletons (if requested)
      if (handleSingletonRows)
        HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));
      return checkLimits(postsolve_stack);
    } else if (analysis_.allow_rule_[kPresolveRuleForcingCol]) {
      // get bound on dual (column) activity
      HighsCDouble sum = 0;
      if (direction > 0)
        sum = impliedDualRowBounds.getSumUpperOrig(col);
      else
        sum = impliedDualRowBounds.getSumLowerOrig(col);
      if (sum == 0.0) {
        // remove column and rows
        if (logging_on) analysis_.startPresolveRuleLog(kPresolveRuleForcingCol);
        postsolve_stack.forcingColumn(
            col, getColumnVector(col), model->col_cost_[col], otherBound,
            direction < 0, model->integrality_[col] == HighsVarType::kInteger);
        markColDeleted(col);
        HighsInt coliter = colhead[col];
        while (coliter != -1) {
          HighsInt row = Arow[coliter];
          double rhs = direction * Avalue[coliter] > 0.0
                           ? model->row_upper_[row]
                           : model->row_lower_[row];
          coliter = Anext[coliter];

          postsolve_stack.forcingColumnRemovedRow(col, row, rhs,
                                                  getRowVector(row));
          removeRow(row);
        }
        analysis_.logging_on_ = logging_on;
        if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleForcingCol);
        return checkLimits(postsolve_stack);
      }
    }
    return Result::kOk;
  };

  // check for dominated column
  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualLower, model->col_lower_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      dominatedCol(col, colDualUpper, model->col_upper_[col], HighsInt{-1}));
  if (colDeleted[col]) return Result::kOk;

  // check for weakly dominated column
  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualLower, model->col_lower_[col],
                         model->col_upper_[col], HighsInt{1}));
  if (colDeleted[col]) return Result::kOk;

  HPRESOLVE_CHECKED_CALL(
      weaklyDominatedCol(col, colDualUpper, model->col_upper_[col],
                         model->col_lower_[col], HighsInt{-1}));
  return Result::kOk;
}